

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

bool __thiscall HttpContext::ParseRequest(HttpContext *this,BufferPtr *buf,uint64_t receive_time)

{
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  HttpRequest *pHVar4;
  char *colon;
  char *end;
  undefined1 local_451;
  undefined4 local_450;
  uint32_t need_len;
  HttpRequest *local_448;
  undefined8 local_440;
  char line_buf [1024];
  
  local_440 = &this->_request;
  pHVar4 = local_440;
  local_448 = (HttpRequest *)receive_time;
  do {
    bVar2 = true;
    local_450 = (undefined4)CONCAT71((int7)((ulong)pHVar4 >> 8),1);
    while( true ) {
      do {
        do {
          while( true ) {
            if (!bVar2) {
              return (bool)((byte)local_450 & 1);
            }
            if (this->_state != ExpectHeaders) break;
            bVar2 = false;
            memset(line_buf,0,0x400);
            need_len = 0;
            peVar1 = (buf->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            uVar3 = (*peVar1->_vptr_Buffer[7])(peVar1,line_buf,0x400,"\r\n",2,&need_len);
            if (uVar3 != 0) {
              end = line_buf + ((ulong)uVar3 - 2);
              local_451 = 0x3a;
              colon = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (line_buf,end,&local_451);
              if (colon == end) {
                this->_state = GotAll;
                bVar2 = false;
              }
              else {
                HttpRequest::AddHeader(local_440,line_buf,colon,end);
                bVar2 = true;
              }
            }
          }
          bVar2 = true;
        } while (this->_state != ExpectRequestLine);
        bVar2 = false;
        memset(line_buf,0,0x400);
        need_len = 0;
        peVar1 = (buf->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        uVar3 = (*peVar1->_vptr_Buffer[7])(peVar1,line_buf,0x400,"\r\n",2,&need_len);
      } while (uVar3 == 0);
      bVar2 = processRequestLine(this,line_buf,line_buf + uVar3);
      if (bVar2) break;
      bVar2 = false;
      local_450 = 0;
    }
    (this->_request)._receive_time = (uint64_t)local_448;
    this->_state = ExpectHeaders;
    pHVar4 = local_448;
  } while( true );
}

Assistant:

bool HttpContext::ParseRequest(cppnet::BufferPtr buf, uint64_t receive_time) {
    bool ok = true;
    bool hasMore = true;
    while (hasMore) {
        if (_state == ExpectRequestLine) {
            char line_buf[1024] = {0};
            uint32_t need_len = 0;
            uint32_t size = buf->ReadUntil(line_buf, 1024, CRLF, CRLF_LEN, need_len);
            if (size > 0) {
                ok = processRequestLine(line_buf, line_buf + size);
                if (ok) {
                    _request.SetReceiveTime(receive_time);
                    _state = ExpectHeaders;

                } else {
                    hasMore = false;
                }

            } else {
                hasMore = false;
            }

        } else if (_state == ExpectHeaders) {
            char line_buf[1024] = { 0 };
            uint32_t need_len = 0;
            uint32_t size = buf->ReadUntil(line_buf, 1024, CRLF, CRLF_LEN, need_len);
            char* end = line_buf + size - CRLF_LEN;
            if (size > 0) {
                const char* colon = std::find(line_buf, end, ':');
                if (colon != end) {
                    _request.AddHeader(line_buf, colon, end);

                } else {
                    // empty line, end of header
                    // FIXME:
                    _state = GotAll;
                    hasMore = false;
                }

            } else {
                hasMore = false;
            }

        } else if (_state == ExpectBody) {
            // TODO:
        }
    }
    return ok;
}